

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3VtabOverloadFunction(sqlite3 *db,FuncDef *pDef,int nArg,Expr *pExpr)

{
  char *__src;
  FuncDef *db_00;
  int iVar1;
  VTable *pVVar2;
  int rc;
  FuncDef *pNew;
  void *pArg;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  sqlite3_module *pMod;
  sqlite3_vtab *pVtab;
  Table *pTab;
  Expr *pExpr_local;
  sqlite3 *psStack_20;
  int nArg_local;
  FuncDef *pDef_local;
  sqlite3 *db_local;
  
  pArg = (void *)0x0;
  pNew = (FuncDef *)0x0;
  db_local = (sqlite3 *)pDef;
  if ((((pExpr != (Expr *)0x0) && (pExpr->op == 0xa2)) &&
      (pVtab = (sqlite3_vtab *)(pExpr->y).pTab, (Table *)pVtab != (Table *)0x0)) &&
     (((Table *)pVtab)->nModuleArg != 0)) {
    pTab = (Table *)pExpr;
    pExpr_local._4_4_ = nArg;
    psStack_20 = (sqlite3 *)pDef;
    pDef_local = (FuncDef *)db;
    pVVar2 = sqlite3GetVTable(db,(Table *)pVtab);
    pMod = (sqlite3_module *)pVVar2->pVtab;
    xSFunc = *(_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr **)pMod;
    if (*(long *)(xSFunc + 0x90) == 0) {
      db_local = psStack_20;
    }
    else {
      iVar1 = (**(code **)(xSFunc + 0x90))
                        (pMod,pExpr_local._4_4_,(char *)psStack_20->lastRowid,&pArg,&pNew);
      db_00 = pDef_local;
      if (iVar1 == 0) {
        db_local = psStack_20;
      }
      else {
        iVar1 = sqlite3Strlen30((char *)psStack_20->lastRowid);
        db_local = (sqlite3 *)sqlite3DbMallocZero((sqlite3 *)db_00,(long)iVar1 + 0x49);
        if (db_local == (sqlite3 *)0x0) {
          db_local = psStack_20;
        }
        else {
          memcpy(db_local,psStack_20,0x48);
          db_local->lastRowid = (i64)&db_local->nSchemaLock;
          __src = (char *)psStack_20->lastRowid;
          iVar1 = sqlite3Strlen30((char *)psStack_20->lastRowid);
          memcpy(&db_local->nSchemaLock,__src,(long)(iVar1 + 1));
          db_local->mutex = (sqlite3_mutex *)pArg;
          db_local->pVdbe = (Vdbe *)pNew;
          *(uint *)((long)&db_local->pVfs + 4) = *(uint *)((long)&db_local->pVfs + 4) | 0x10;
        }
      }
    }
  }
  return (FuncDef *)db_local;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3VtabOverloadFunction(
  sqlite3 *db,    /* Database connection for reporting malloc problems */
  FuncDef *pDef,  /* Function to possibly overload */
  int nArg,       /* Number of arguments to the function */
  Expr *pExpr     /* First argument to the function */
){
  Table *pTab;
  sqlite3_vtab *pVtab;
  sqlite3_module *pMod;
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**) = 0;
  void *pArg = 0;
  FuncDef *pNew;
  int rc = 0;

  /* Check to see the left operand is a column in a virtual table */
  if( NEVER(pExpr==0) ) return pDef;
  if( pExpr->op!=TK_COLUMN ) return pDef;
  pTab = pExpr->y.pTab;
  if( pTab==0 ) return pDef;
  if( !IsVirtual(pTab) ) return pDef;
  pVtab = sqlite3GetVTable(db, pTab)->pVtab;
  assert( pVtab!=0 );
  assert( pVtab->pModule!=0 );
  pMod = (sqlite3_module *)pVtab->pModule;
  if( pMod->xFindFunction==0 ) return pDef;
 
  /* Call the xFindFunction method on the virtual table implementation
  ** to see if the implementation wants to overload this function.
  **
  ** Though undocumented, we have historically always invoked xFindFunction
  ** with an all lower-case function name.  Continue in this tradition to
  ** avoid any chance of an incompatibility.
  */
#ifdef SQLITE_DEBUG
  {
    int i;
    for(i=0; pDef->zName[i]; i++){
      unsigned char x = (unsigned char)pDef->zName[i];
      assert( x==sqlite3UpperToLower[x] );
    }
  }
#endif
  rc = pMod->xFindFunction(pVtab, nArg, pDef->zName, &xSFunc, &pArg);
  if( rc==0 ){
    return pDef;
  }

  /* Create a new ephemeral function definition for the overloaded
  ** function */
  pNew = sqlite3DbMallocZero(db, sizeof(*pNew)
                             + sqlite3Strlen30(pDef->zName) + 1);
  if( pNew==0 ){
    return pDef;
  }
  *pNew = *pDef;
  pNew->zName = (const char*)&pNew[1];
  memcpy((char*)&pNew[1], pDef->zName, sqlite3Strlen30(pDef->zName)+1);
  pNew->xSFunc = xSFunc;
  pNew->pUserData = pArg;
  pNew->funcFlags |= SQLITE_FUNC_EPHEM;
  return pNew;
}